

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

stumpless_filter_func_t stumpless_get_target_filter(stumpless_target *target)

{
  stumpless_filter_func_t filter;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    lock_target(target);
    target_local = (stumpless_target *)target->filter;
    unlock_target(target);
    clear_error();
  }
  return (stumpless_filter_func_t)target_local;
}

Assistant:

stumpless_filter_func_t
stumpless_get_target_filter( const struct stumpless_target *target ) {
  stumpless_filter_func_t filter;

  VALIDATE_ARG_NOT_NULL( target );

  lock_target( target );
  filter = target->filter;
  unlock_target( target );

  clear_error(  );
  return filter;
}